

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O0

void remove_set(artifact_set *set)

{
  object *obj_00;
  object *obj;
  wchar_t j;
  wchar_t i;
  set_item *item;
  artifact_set *set_local;
  
  for (_j = set->set_item; _j != (set_item *)0x0; _j = _j->next) {
    for (obj._4_4_ = 0; obj._4_4_ < (int)(uint)(player->body).count; obj._4_4_ = obj._4_4_ + 1) {
      obj_00 = (player->body).slots[obj._4_4_].obj;
      if (((obj_00 != (object *)0x0) && (obj_00->artifact != (artifact *)0x0)) &&
         (obj_00->artifact->aidx == _j->aidx)) {
        flag_wipe(obj_00->flags,6);
        flag_union(obj_00->flags,obj_00->artifact->flags,6);
        for (obj._0_4_ = 0; (int)obj < 0x11; obj._0_4_ = (int)obj + 1) {
          obj_00->modifiers[(int)obj] = obj_00->artifact->modifiers[(int)obj];
        }
        for (obj._0_4_ = 0; (int)obj < 0x1c; obj._0_4_ = (int)obj + 1) {
          obj_00->el_info[(int)obj].res_level = obj_00->artifact->el_info[(int)obj].res_level;
        }
        if (obj_00->artifact->brands == (_Bool *)0x0) {
          mem_free(obj_00->brands);
          obj_00->brands = (_Bool *)0x0;
        }
        else {
          if (obj_00->brands != (_Bool *)0x0) {
            memset(obj_00->brands,0,(ulong)z_info->brand_max);
          }
          copy_brands(&obj_00->brands,obj_00->artifact->brands);
        }
        if (obj_00->artifact->slays == (_Bool *)0x0) {
          mem_free(obj_00->slays);
          obj_00->slays = (_Bool *)0x0;
        }
        else {
          if (obj_00->slays != (_Bool *)0x0) {
            memset(obj_00->slays,0,(ulong)z_info->slay_max);
          }
          copy_slays(&obj_00->slays,obj_00->artifact->slays);
        }
        player_know_object(player,obj_00);
      }
    }
  }
  msg("Item set no longer completed.");
  return;
}

Assistant:

void remove_set(struct artifact_set *set)
{
	struct set_item *item = set->set_item;
	while (item) {
		int i, j;
		/* Find the item worn by the player */
		for (i = 0; i < player->body.count; i++) {
			struct object *obj = player->body.slots[i].obj;
			if (obj && obj->artifact && (obj->artifact->aidx == item->aidx)) {
				/* Remove flags */
				of_wipe(obj->flags);
				of_union(obj->flags, obj->artifact->flags);

				/* Remove modifiers */
				for (j = 0; j < OBJ_MOD_MAX; j++) {
					obj->modifiers[j] = obj->artifact->modifiers[j];
				}

				/* Remove extra resists */
				for (j = 0; j < ELEM_MAX; j++) {
					obj->el_info[j].res_level =
						obj->artifact->el_info[j].res_level;
				}

				/* Brands */
				if (obj->artifact->brands) {
					if (obj->brands) {
						memset(obj->brands, 0,
							z_info->brand_max
							* sizeof(*obj->brands));
					}
					copy_brands(&obj->brands,
						obj->artifact->brands);
				} else {
					mem_free(obj->brands);
					obj->brands = NULL;
				}

				/* Slays */
				if (obj->artifact->slays) {
					if (obj->slays) {
						memset(obj->slays, 0,
							z_info->slay_max
							* sizeof(*obj->slays));
					}
					copy_slays(&obj->slays,
						obj->artifact->slays);
				} else {
					mem_free(obj->slays);
					obj->slays = NULL;
				}

				player_know_object(player, obj);
			}
		}
		item = item->next;
	}

	/* Notify */
	msg("Item set no longer completed.");
}